

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O3

void __thiscall unitStrings_invcube_Test::TestBody(unitStrings_invcube_Test *this)

{
  uint extraout_EAX;
  precise_unit *un;
  uint64_t in_RCX;
  char *message;
  double in_XMM1_Qa;
  string res;
  precise_unit funit;
  AssertHelper AStack_68;
  Message local_60;
  internal local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  double local_48;
  string local_40;
  double local_20;
  ulong local_18;
  
  local_48 = units::detail::power_const<double>(5.029210058420117,-3);
  units::detail::unit_data::pow((unit_data *)(units::precise::us::rod + 8),local_48,in_XMM1_Qa);
  local_18 = (ulong)extraout_EAX;
  local_20 = local_48;
  un = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_40,(units *)&local_20,un,in_RCX);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[7]>
            (local_58,"res","\"1/rd^3\"",&local_40,(char (*) [7])"1/rd^3");
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message(&local_60);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x137,message);
    testing::internal::AssertHelper::operator=(&AStack_68,&local_60);
    testing::internal::AssertHelper::~AssertHelper(&AStack_68);
    if (local_60.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_60.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(unitStrings, invcube)
{
    auto funit = precise::us::rod.pow(-3);
    auto res = to_string(funit);
    EXPECT_EQ(res, "1/rd^3");
}